

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O3

void __thiscall Memory::RecyclerParallelThread::Shutdown(RecyclerParallelThread *this)

{
  code *pcVar1;
  bool bVar2;
  DWORD DVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  HANDLE local_28;
  HANDLE handles [2];
  
  pRVar5 = this->recycler;
  if ((pRVar5->collectionState).value != CollectionStateExit) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1b34,"(this->recycler->collectionState == CollectionStateExit)",
                       "this->recycler->collectionState == CollectionStateExit");
    if (!bVar2) goto LAB_00713a58;
    *puVar4 = 0;
    pRVar5 = this->recycler;
  }
  if (pRVar5->threadService->threadService == (ThreadServiceCallback)0x0) {
    if (this->concurrentThread != (HANDLE)0x0) {
      local_28 = this->concurrentWorkDoneEvent;
      handles[0] = this->concurrentThread;
      SetEvent(this->concurrentWorkReadyEvent);
      DVar3 = WaitForMultipleObjectsEx(2,&local_28,0,0xffffffff,0);
      if (DVar3 == 0xffffffff) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0x1b4b,"(fRet != ((DWORD)0xFFFFFFFF))",
                           "Check handles passed to WaitForMultipleObjectsEx.");
        if (!bVar2) goto LAB_00713a58;
        *puVar4 = 0;
      }
      CloseHandle(this->concurrentWorkDoneEvent);
      this->concurrentWorkDoneEvent = (HANDLE)0x0;
      CloseHandle(this->concurrentWorkReadyEvent);
      this->concurrentWorkReadyEvent = (HANDLE)0x0;
      CloseHandle(this->concurrentThread);
      this->concurrentThread = (HANDLE)0x0;
    }
  }
  else if (this->concurrentWorkDoneEvent != (HANDLE)0x0) {
    CloseHandle(this->concurrentWorkDoneEvent);
    this->concurrentWorkDoneEvent = (HANDLE)0x0;
  }
  if (this->concurrentThread != (HANDLE)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1b56,"(this->concurrentThread == 0)","this->concurrentThread == NULL");
    if (!bVar2) goto LAB_00713a58;
    *puVar4 = 0;
  }
  if (this->concurrentWorkReadyEvent != (HANDLE)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,6999,"(this->concurrentWorkReadyEvent == 0)",
                       "this->concurrentWorkReadyEvent == NULL");
    if (!bVar2) goto LAB_00713a58;
    *puVar4 = 0;
  }
  if (this->concurrentWorkDoneEvent != (HANDLE)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,7000,"(this->concurrentWorkDoneEvent == 0)",
                       "this->concurrentWorkDoneEvent == NULL");
    if (!bVar2) {
LAB_00713a58:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return;
}

Assistant:

void
RecyclerParallelThread::Shutdown()
{
    Assert(this->recycler->collectionState == CollectionStateExit);

    if (this->recycler->threadService->HasCallback())
    {
        if (this->concurrentWorkDoneEvent != NULL)
        {
            CloseHandle(this->concurrentWorkDoneEvent);
            this->concurrentWorkDoneEvent = NULL;
        }
    }
    else
    {
        if (this->concurrentThread != NULL)
        {
            HANDLE handles[2] = { concurrentWorkDoneEvent, concurrentThread };

            SetEvent(concurrentWorkReadyEvent);

            // During process shutdown, OS might kill this (recycler parallel i.e. concurrent) thread and it will not get chance to signal concurrentWorkDoneEvent.
            // When we are performing shutdown of main (recycler) thread here, if we wait on concurrentWorkDoneEvent, WaitForObject() will never return.
            // Hence wait for concurrentWorkDoneEvent + concurrentThread so if concurrentThread got killed, WaitForObject() will return and we will
            // proceed further.
            DWORD fRet = WaitForMultipleObjectsEx(2, handles, FALSE, INFINITE, FALSE);
            AssertMsg(fRet != WAIT_FAILED, "Check handles passed to WaitForMultipleObjectsEx.");

            CloseHandle(this->concurrentWorkDoneEvent);
            this->concurrentWorkDoneEvent = NULL;
            CloseHandle(this->concurrentWorkReadyEvent);
            this->concurrentWorkReadyEvent = NULL;
            CloseHandle(this->concurrentThread);
            this->concurrentThread = NULL;
        }
    }

    Assert(this->concurrentThread == NULL);
    Assert(this->concurrentWorkReadyEvent == NULL);
    Assert(this->concurrentWorkDoneEvent == NULL);
}